

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

void av1_free_cdef_buffers(AV1_COMMON *cm,AV1CdefWorkerData **cdef_worker,AV1CdefSync *cdef_sync)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  AV1CdefWorkerData *pAVar2;
  bool bVar3;
  AV1CdefRowSync *pAVar4;
  long lVar5;
  int plane;
  long lVar6;
  ulong uVar7;
  
  uVar1 = (cm->cdef_info).allocated_mi_rows;
  lVar6 = 0;
  do {
    aom_free((cm->cdef_info).linebuf[lVar6]);
    (cm->cdef_info).linebuf[lVar6] = (uint16_t *)0x0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  aom_free((cm->cdef_info).srcbuf);
  (cm->cdef_info).srcbuf = (uint16_t *)0x0;
  lVar6 = 0;
  do {
    aom_free((cm->cdef_info).colbuf[lVar6]);
    (cm->cdef_info).colbuf[lVar6] = (uint16_t *)0x0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  pAVar4 = cdef_sync->cdef_row_mt;
  if (pAVar4 != (AV1CdefRowSync *)0x0) {
    if (0 < (int)uVar1) {
      lVar6 = 0;
      do {
        pAVar4 = cdef_sync->cdef_row_mt;
        __mutex = *(pthread_mutex_t **)((long)&pAVar4->row_mutex_ + lVar6);
        if (__mutex != (pthread_mutex_t *)0x0) {
          pthread_mutex_destroy(__mutex);
          aom_free(*(void **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar6));
          pAVar4 = cdef_sync->cdef_row_mt;
        }
        __cond = *(pthread_cond_t **)((long)&pAVar4->row_cond_ + lVar6);
        if (__cond != (pthread_cond_t *)0x0) {
          pthread_cond_destroy(__cond);
          aom_free(*(void **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar6));
        }
        lVar6 = lVar6 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar6);
      pAVar4 = cdef_sync->cdef_row_mt;
    }
    aom_free(pAVar4);
    cdef_sync->cdef_row_mt = (AV1CdefRowSync *)0x0;
  }
  uVar1 = (cm->cdef_info).allocated_num_workers;
  if ((1 < (int)uVar1) && (*cdef_worker != (AV1CdefWorkerData *)0x0)) {
    lVar6 = (ulong)uVar1 * 0x1f8 + -0x1e8;
    uVar7 = (ulong)uVar1;
    do {
      pAVar2 = *cdef_worker;
      aom_free(pAVar2[uVar7 - 1].srcbuf);
      pAVar2[uVar7 - 1].srcbuf = (uint16_t *)0x0;
      lVar5 = 0;
      do {
        aom_free(*(void **)((long)pAVar2->colbuf + lVar5 * 8 + lVar6 + -0x10));
        *(undefined8 *)((long)pAVar2->colbuf + lVar5 * 8 + lVar6 + -0x10) = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar6 = lVar6 + -0x1f8;
      bVar3 = 2 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar3);
    aom_free(*cdef_worker);
    *cdef_worker = (AV1CdefWorkerData *)0x0;
  }
  return;
}

Assistant:

void av1_free_cdef_buffers(AV1_COMMON *const cm,
                           AV1CdefWorkerData **cdef_worker,
                           AV1CdefSync *cdef_sync) {
  CdefInfo *cdef_info = &cm->cdef_info;
  const int num_mi_rows = cdef_info->allocated_mi_rows;

  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    aom_free(cdef_info->linebuf[plane]);
    cdef_info->linebuf[plane] = NULL;
  }
  // De-allocation of column buffer & source buffer (worker_0).
  free_cdef_bufs(cdef_info->colbuf, &cdef_info->srcbuf);

  free_cdef_row_sync(&cdef_sync->cdef_row_mt, num_mi_rows);

  if (cdef_info->allocated_num_workers < 2) return;
  if (*cdef_worker != NULL) {
    for (int idx = cdef_info->allocated_num_workers - 1; idx >= 1; idx--) {
      // De-allocation of column buffer & source buffer for remaining workers.
      free_cdef_bufs((*cdef_worker)[idx].colbuf, &(*cdef_worker)[idx].srcbuf);
    }
    aom_free(*cdef_worker);
    *cdef_worker = NULL;
  }
}